

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O3

void convertMidiFileToSvg(stringstream *output,MidiFile *midifile,Options *options)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  MidiEventList *pMVar8;
  MidiEvent *pMVar9;
  int j;
  int iVar10;
  int iVar11;
  long lVar12;
  int j_1;
  char *pcVar13;
  ulong uVar14;
  double totalduration;
  int maxpitch;
  int minpitch;
  vector<double,_std::allocator<double>_> trackhues;
  string strokecolor;
  stringstream notes;
  int local_228;
  int local_224;
  string local_220;
  double local_200;
  vector<double,_std::allocator<double>_> local_1f8;
  stringstream *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = output;
  smf::MidiFile::linkNotePairsFIFO(midifile);
  smf::MidiFile::doTimeAnalysis(midifile);
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (staffQ != 0) {
    local_200 = StaffThickness;
    totalduration = smf::MidiFile::getFileDurationInSeconds(midifile);
    drawStaves(local_1a8,local_200,&StaffColor_abi_cxx11_,totalduration);
    if (clefQ != 0) {
      drawClefs(local_1a8);
    }
    if (braceQ != 0) {
      drawBrace(local_1a8);
    }
  }
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"stroke-color","");
  smf::Options::getString(&local_1d8,options,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"stroke-width","");
  local_200 = smf::Options::getDouble(options,&local_220);
  local_200 = local_200 * Scale;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t<g",3);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," style=\"",8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"stroke-width:",0xd);
  poVar7 = std::ostream::_M_insert<double>(local_200);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," stroke:",8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,">\n",2);
  getTrackHues(&local_1f8,midifile);
  if (lineQ != 0) {
    drawLines(local_1a8,midifile,&local_1f8,options);
  }
  local_224 = 0;
  local_228 = 0;
  if (bwQ == 0) {
    uVar4 = smf::MidiFile::size(midifile);
    if (0 < (int)uVar4) {
      uVar14 = (ulong)uVar4;
      do {
        uVar1 = uVar14 - 1;
        iVar11 = (int)uVar1;
        pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
        iVar5 = hasNotes(pMVar8);
        if (iVar5 != 0) {
          pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
          getMinMaxTrackPitch(pMVar8,&local_224,&local_228);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t\t<g",4);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," opacity=\"0.5\"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8," class=\"note-backdrops ",0x17);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"track-",6);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
          if (0.0 <= local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar1]) {
            if (bwQ == 0) {
              pcVar13 = "fill:white;";
              if (darkQ == 0) {
                pcVar13 = "fill:black;";
              }
              lVar12 = 0xb;
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8," style=\"",8);
            }
            else {
              lVar12 = 10;
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8," style=\"",8);
              pcVar13 = "fill:none;";
            }
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar13,lVar12);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," >\n",3);
          iVar2 = local_224;
          iVar5 = local_228;
          iVar10 = 0;
          while( true ) {
            pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
            iVar6 = smf::MidiEventList::size(pMVar8);
            if (iVar6 <= iVar10) break;
            pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar10);
            bVar3 = smf::MidiMessage::isNoteOn(&pMVar9->super_MidiMessage);
            if (bVar3) {
              if ((drumQ == 0.0) && (!NAN(drumQ))) {
                pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
                pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar10);
                iVar6 = smf::MidiMessage::getChannel(&pMVar9->super_MidiMessage);
                if (iVar6 == 9) goto LAB_00117097;
              }
              drawNote(local_1a8,midifile,iVar11,iVar10,0,iVar2,iVar5);
            }
LAB_00117097:
            iVar10 = iVar10 + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t\t</g>\n",7);
        }
        bVar3 = 1 < (long)uVar14;
        uVar14 = uVar1;
      } while (bVar3);
    }
  }
  uVar4 = smf::MidiFile::size(midifile);
  if (0 < (int)uVar4) {
    uVar14 = (ulong)uVar4;
    do {
      uVar1 = uVar14 - 1;
      iVar11 = (int)uVar1;
      pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
      iVar5 = hasNotes(pMVar8);
      if (iVar5 != 0) {
        pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
        getMinMaxTrackPitch(pMVar8,&local_224,&local_228);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t\t<g",4);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," class=\"track-",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
        if ((transparentQ != 0) && (bwQ == 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8," filter=\"url(#constantOpacity)\"",0x1f);
        }
        if (0.0 <= local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1]) {
          if (bwQ == 0) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8," style=\"",8);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"opacity:",8);
            poVar7 = std::ostream::_M_insert<double>(Opacity);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," fill:hsl(",10);
            poVar7 = std::ostream::_M_insert<double>
                               (local_1f8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", 100%, 75%);",0xd);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8," style=\"",8);
            poVar7 = local_1a8;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," fill:white;",0xc);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," >\n",3);
        iVar2 = local_224;
        iVar5 = local_228;
        iVar10 = 0;
        while( true ) {
          pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
          iVar6 = smf::MidiEventList::size(pMVar8);
          if (iVar6 <= iVar10) break;
          pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar10);
          bVar3 = smf::MidiMessage::isNoteOn(&pMVar9->super_MidiMessage);
          if (bVar3) {
            if ((drumQ == 0.0) && (!NAN(drumQ))) {
              pMVar8 = smf::MidiFile::operator[](midifile,iVar11);
              pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar10);
              iVar6 = smf::MidiMessage::getChannel(&pMVar9->super_MidiMessage);
              if (iVar6 == 9) goto LAB_0011734e;
            }
            drawNote(local_1a8,midifile,iVar11,iVar10,dataQ,iVar2,iVar5);
          }
LAB_0011734e:
          iVar10 = iVar10 + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t\t</g>\n",7);
      }
      bVar3 = 1 < (long)uVar14;
      uVar14 = uVar1;
    } while (bVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t</g>\n",6);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1e0 + 0x10),local_220._M_dataplus._M_p,local_220._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void convertMidiFileToSvg(stringstream& output, MidiFile& midifile,
		Options& options) {

	midifile.linkNotePairs();    // first link note-ons to note-offs
	midifile.doTimeAnalysis();   // then create ticks to seconds mapping

	stringstream notes;

	if (staffQ) {
		drawStaves(notes, StaffThickness, StaffColor,
				midifile.getFileDurationInSeconds());
		if (clefQ) {
			drawClefs(notes);
		}
		if (braceQ) {
			drawBrace(notes);
		}
	}

	string strokecolor = options.getString("stroke-color");
	double strokewidth = options.getDouble("stroke-width") * Scale;
	notes << "\t<g"
	      << " style=\""
	      <<   "stroke-width:" << strokewidth << ";"
	      <<   " stroke:" << strokecolor << ";"
	      << "\""
	      << ">\n";

	vector<double> trackhues = getTrackHues(midifile);

	if (lineQ) {
		drawLines(notes, midifile, trackhues, options);
	}

	int minpitch = 0;
	int maxpitch = 0;

	// Draw background for increasing contrast of notes and background
	// (needed due to constant opacity filter):
	int track = 0;
	if (!bwQ) {
		for (int i=midifile.size()-1; i>=0; i--) {
			if (!hasNotes(midifile[i])) {
				continue;
			}
			getMinMaxTrackPitch(midifile[i], minpitch, maxpitch);
			track = i;
			notes << "\t\t<g"
					<< " opacity=\"0.5\"";
			notes << " class=\"note-backdrops " << "track-" << i << "\"";
			if (trackhues[i] >= 0.0) {
				if (bwQ) {
					notes << " style=\""
					      << "fill:none;"
					      << "\"";
				 } else if (darkQ) {
					notes << " style=\""
					      << "fill:white;"
					      << "\"";
				 } else {
					notes << " style=\""
					      << "fill:black;"
					      << "\"";
				 }
			}
			notes << " >\n";
			for (int j=0; j<midifile[i].size(); j++) {
				if (!midifile[i][j].isNoteOn()) {
					continue;
				}
				if (!drumQ) {
					if (midifile[i][j].getChannel() == 0x09) {
						continue;
					}
				}
				drawNote(notes, midifile, i, j, 0, minpitch, maxpitch);
			}
			notes << "\t\t</g>\n";
		}
	}

	// draw the actual notes:
	for (int i=midifile.size()-1; i>=0; i--) {
		if (!hasNotes(midifile[i])) {
			continue;
		}
		track = i;
		getMinMaxTrackPitch(midifile[i], minpitch, maxpitch);
		notes << "\t\t<g"
		      << " class=\"track-" << track << "\"";
		if (transparentQ && !bwQ) {
			notes << " filter=\"url(#constantOpacity)\"";
		}
		if (trackhues[i] >= 0.0) {
			if (bwQ) {
				notes << " style=\""
				      << " fill:white;"
				      << "\"";
			} else {
				notes << " style=\""
				      << "opacity:" << Opacity << ";"
				      << " fill:hsl(" << trackhues[i] << ", 100%, 75%);"
				      << "\"";
			}
		}
		notes << " >\n";

		for (int j=0; j<midifile[i].size(); j++) {
			if (!midifile[i][j].isNoteOn()) {
				continue;
			}
			if (!drumQ) {
				if (midifile[i][j].getChannel() == 0x09) {
					continue;
				}
			}

			drawNote(notes, midifile, i, j, dataQ, minpitch, maxpitch);
		}
		notes << "\t\t</g>\n";
	}
	notes << "\t</g>\n";

	output << notes.str();
}